

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O2

string * spvTargetEnvList_abi_cxx11_(string *__return_storage_ptr__,int pad,int wrap)

{
  ulong uVar1;
  long lVar2;
  string line;
  string word;
  string sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = (ulong)(wrap - pad);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&sep,"",(allocator<char> *)&word);
  for (lVar2 = 0; lVar2 != 0x1a0; lVar2 = lVar2 + 0x10) {
    std::operator+(&word,&sep,*(char **)((long)&spvTargetEnvNameMap[0].first + lVar2));
    if (uVar1 < word._M_string_length + line._M_string_length) {
      std::operator+(&local_50,&line,"\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::assign((ulong)&line,(char)pad);
      uVar1 = (long)wrap;
    }
    std::__cxx11::string::append((string *)&line);
    std::__cxx11::string::assign((char *)&sep);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string spvTargetEnvList(const int pad, const int wrap) {
  std::string ret;
  size_t max_line_len = wrap - pad;  // The first line isn't padded
  std::string line;
  std::string sep = "";

  for (auto& name_env : spvTargetEnvNameMap) {
    std::string word = sep + name_env.first;
    if (line.length() + word.length() > max_line_len) {
      // Adding one word wouldn't fit, commit the line in progress and
      // start a new one.
      ret += line + "\n";
      line.assign(pad, ' ');
      // The first line is done. The max length now comprises the
      // padding.
      max_line_len = wrap;
    }
    line += word;
    sep = "|";
  }

  ret += line;

  return ret;
}